

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrandr.c
# Opt level: O0

xrandr_mode * xrandr_fetch_mode(ALLEGRO_SYSTEM_XGLX *s,int sid,RRMode id)

{
  void *pvVar1;
  size_t sVar2;
  xrandr_mode *pxVar3;
  RRMode in_RDX;
  uint in_ESI;
  long in_RDI;
  xrandr_mode *mode;
  xrandr_screen *screen;
  uint i;
  uint local_24;
  
  pvVar1 = _al_vector_ref((_AL_VECTOR *)(in_RDI + 0x138),in_ESI);
  local_24 = 0;
  while( true ) {
    sVar2 = _al_vector_size((_AL_VECTOR *)((long)pvVar1 + 0x58));
    if (sVar2 <= local_24) {
      return (xrandr_mode *)0x0;
    }
    pxVar3 = (xrandr_mode *)_al_vector_ref((_AL_VECTOR *)((long)pvVar1 + 0x58),local_24);
    if (pxVar3->id == in_RDX) break;
    local_24 = local_24 + 1;
  }
  return pxVar3;
}

Assistant:

static xrandr_mode *xrandr_fetch_mode(ALLEGRO_SYSTEM_XGLX *s, int sid, RRMode id)
{
   unsigned int i;
   
   xrandr_screen *screen = _al_vector_ref(&s->xrandr_screens, sid);

   for(i = 0; i < _al_vector_size(&screen->modes); i++) {
      xrandr_mode *mode = _al_vector_ref(&screen->modes, i);
      if(mode->id == id)
         return mode;
   }
   
   return NULL;
}